

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void move_model(void)

{
  float fVar1;
  
  fVar1 = deltaTime * 3.0;
  if (keys[0x57]) {
    position.field_2.z = position.field_2.z + fVar1;
  }
  if (keys[0x53]) {
    position.field_2.z = position.field_2.z - fVar1;
  }
  if (keys[0x41]) {
    position.field_0.x = position.field_0.x + fVar1;
  }
  if (keys[0x44]) {
    position.field_0.x = position.field_0.x - fVar1;
  }
  if (keys[0x4a]) {
    position.field_1.y = position.field_1.y - fVar1;
  }
  if (keys[0x4b]) {
    position.field_1.y = position.field_1.y + fVar1;
  }
  if (keys[0x55]) {
    x_angle = x_angle + fVar1;
  }
  if (keys[0x4d]) {
    x_angle = x_angle - fVar1;
  }
  if (keys[0x49]) {
    y_angle = y_angle + fVar1;
  }
  if (keys[0x2c]) {
    y_angle = y_angle - fVar1;
  }
  if (keys[0x4f]) {
    z_angle = z_angle + fVar1;
  }
  if (keys[0x2e]) {
    z_angle = z_angle - fVar1;
  }
  return;
}

Assistant:

void move_model() {
    // Camera controls
    GLfloat tspeed = translateSpeed * deltaTime;
    GLfloat rspeed = rotateSpeed * deltaTime;
    if (keys[GLFW_KEY_W])
        position.z += tspeed;
    if (keys[GLFW_KEY_S])
        position.z -= tspeed;
    if (keys[GLFW_KEY_A])
        position.x += tspeed;
    if (keys[GLFW_KEY_D])
        position.x -= tspeed;
    if (keys[GLFW_KEY_J])
        position.y -= tspeed;
    if (keys[GLFW_KEY_K])
        position.y += tspeed;
    if (keys[GLFW_KEY_U])
        x_angle += rspeed;
    if (keys[GLFW_KEY_M])
        x_angle -= rspeed;
    if (keys[GLFW_KEY_I])
        y_angle += rspeed;
    if (keys[GLFW_KEY_COMMA])
        y_angle -= rspeed;
    if (keys[GLFW_KEY_O])
        z_angle += rspeed;
    if (keys[GLFW_KEY_PERIOD])
        z_angle -= rspeed;
}